

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

void evutil_getaddrinfo_infer_protocols(addrinfo *hints)

{
  int iVar1;
  int iVar2;
  
  iVar1 = hints->ai_socktype;
  iVar2 = hints->ai_protocol;
  if (iVar2 == 0) {
    if (iVar1 == 1) {
      hints->ai_protocol = 6;
      return;
    }
    if (iVar1 == 2) {
      hints->ai_protocol = 0x11;
      return;
    }
  }
  if (iVar1 == 0) {
    if ((iVar2 == 6) || (iVar2 == 0x84)) {
      hints->ai_socktype = 1;
      return;
    }
    if (iVar2 == 0x11) {
      hints->ai_socktype = 2;
      return;
    }
  }
  return;
}

Assistant:

static void
evutil_getaddrinfo_infer_protocols(struct evutil_addrinfo *hints)
{
	/* If we can guess the protocol from the socktype, do so. */
	if (!hints->ai_protocol && hints->ai_socktype) {
		if (hints->ai_socktype == SOCK_DGRAM)
			hints->ai_protocol = IPPROTO_UDP;
		else if (hints->ai_socktype == SOCK_STREAM)
			hints->ai_protocol = IPPROTO_TCP;
	}

	/* Set the socktype if it isn't set. */
	if (!hints->ai_socktype && hints->ai_protocol) {
		if (hints->ai_protocol == IPPROTO_UDP)
			hints->ai_socktype = SOCK_DGRAM;
		else if (hints->ai_protocol == IPPROTO_TCP)
			hints->ai_socktype = SOCK_STREAM;
#ifdef IPPROTO_SCTP
		else if (hints->ai_protocol == IPPROTO_SCTP)
			hints->ai_socktype = SOCK_STREAM;
#endif
	}
}